

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Person.cpp
# Opt level: O0

string * __thiscall
mbc::Val::Person::str_width_abi_cxx11_(string *__return_storage_ptr__,Person *this,int width)

{
  allocator local_3f1;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string body_string;
  int width_local;
  Person *this_local;
  
  body_string.field_2._12_4_ = width;
  if ((*(this->super_ValBase).is_vaild_ & 1U) == 0) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(this->super_ValBase).invaild_waring_);
  }
  else {
    ValBase::str_abi_cxx11_(&local_220,(ValBase *)this->name_);
    std::operator+(&local_200,"name: ",&local_220);
    std::operator+(&local_1e0,&local_200,", sex: ");
    ValBase::str_abi_cxx11_(&local_250,(ValBase *)this->sex_);
    std::operator+(&local_1c0,&local_1e0,&local_250);
    std::operator+(&local_1a0,&local_1c0,", telephone: ");
    ValBase::str_abi_cxx11_(&local_270,(ValBase *)this->telephone_);
    std::operator+(&local_180,&local_1a0,&local_270);
    std::operator+(&local_160,&local_180,", mail_number: ");
    ValBase::str_abi_cxx11_(&local_290,(ValBase *)this->mail_number_);
    std::operator+(&local_140,&local_160,&local_290);
    std::operator+(&local_120,&local_140,", email:");
    ValBase::str_abi_cxx11_(&local_2b0,(ValBase *)this->email_);
    std::operator+(&local_100,&local_120,&local_2b0);
    std::operator+(&local_e0,&local_100,", qq_number: ");
    ValBase::str_abi_cxx11_(&local_2d0,(ValBase *)this->qq_number_);
    std::operator+(&local_c0,&local_e0,&local_2d0);
    std::operator+(&local_a0,&local_c0,", location: ");
    ValBase::str_abi_cxx11_(&local_2f0,(ValBase *)this->location_);
    std::operator+(&local_80,&local_a0,&local_2f0);
    std::operator+(&local_60,&local_80,", classes: ");
    ValBase::str_abi_cxx11_(&local_310,(ValBase *)this->classes_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    ValBase::str_abi_cxx11_(&local_370,(ValBase *)this->ID_);
    std::operator+(&local_350,"+------| id: ",&local_370);
    std::operator+(&local_330,&local_350," |------\n");
    std::__cxx11::string::string((string *)&local_3d0,(string *)local_40);
    units::hard_warp(&local_3b0,&local_3d0,body_string.field_2._12_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f0,"| ",&local_3f1);
    units::add_head(&local_390,&local_3b0,&local_3f0);
    std::operator+(__return_storage_ptr__,&local_330,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

const string Person::str_width(int width) const {
    if (*is_vaild_) {
		string body_string =
			"name: " + name_->str() + ", sex: " + sex_->str() + ", telephone: " +
			telephone_->str() + ", mail_number: " + mail_number_->str() + ", email:" +
			email_->str() + ", qq_number: " + qq_number_->str() + ", location: " +
			location_->str() + ", classes: " + classes_->str();
		return "+------| id: " + ID_->str() + " |------\n"
			   + units::add_head(units::hard_warp(body_string, width), "| ");
    } else {
        return *invaild_waring_;
    }
}